

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

Filter * helics::generateFilter
                   (Federate *fed,bool global,bool cloning,string_view name,FilterTypes operation,
                   string_view inputType,string_view outputType)

{
  string_view type_out;
  string_view type_out_00;
  string_view outputType_00;
  string_view outputType_01;
  Filter *this;
  ConnectorFederateManager *pCVar1;
  string_view type_in;
  string_view type_in_00;
  string_view inputType_00;
  string_view inputType_01;
  
  if (outputType._M_len == 0 && inputType._M_len == 0) {
    if (!cloning) {
      if (!global) {
        outputType._M_len = 0;
        outputType._M_str = (char *)0x0;
        inputType._M_len = 0;
        inputType._M_str = (char *)0x0;
LAB_001b1f90:
        outputType_01._M_str = outputType._M_str;
        outputType_01._M_len = outputType._M_len;
        inputType_01._M_str = inputType._M_str;
        inputType_01._M_len = inputType._M_len;
        this = Federate::registerFilter(fed,name,inputType_01,outputType_01);
        goto LAB_001b1f95;
      }
      pCVar1 = (fed->cManager)._M_t.
               super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
               .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
      outputType._M_len = 0;
      outputType._M_str = (char *)0x0;
      inputType._M_len = 0;
      inputType._M_str = (char *)0x0;
LAB_001b1f34:
      type_out_00._M_str = outputType._M_str;
      type_out_00._M_len = outputType._M_len;
      type_in_00._M_str = inputType._M_str;
      type_in_00._M_len = inputType._M_len;
      this = ConnectorFederateManager::registerFilter(pCVar1,name,type_in_00,type_out_00);
      goto LAB_001b1f95;
    }
    if (!global) {
      outputType._M_len = 0;
      outputType._M_str = (char *)0x0;
      inputType._M_len = 0;
      inputType._M_str = (char *)0x0;
LAB_001b1f62:
      outputType_00._M_str = outputType._M_str;
      outputType_00._M_len = outputType._M_len;
      inputType_00._M_str = inputType._M_str;
      inputType_00._M_len = inputType._M_len;
      this = &Federate::registerCloningFilter(fed,name,inputType_00,outputType_00)->super_Filter;
      goto LAB_001b1f95;
    }
    pCVar1 = (fed->cManager)._M_t.
             super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
             .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
    outputType._M_len = 0;
    outputType._M_str = (char *)0x0;
    inputType._M_len = 0;
    inputType._M_str = (char *)0x0;
  }
  else {
    if (!cloning) {
      if (!global) goto LAB_001b1f90;
      pCVar1 = (fed->cManager)._M_t.
               super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
               .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
      goto LAB_001b1f34;
    }
    if (!global) goto LAB_001b1f62;
    pCVar1 = (fed->cManager)._M_t.
             super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
             .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
  }
  type_out._M_str = outputType._M_str;
  type_out._M_len = outputType._M_len;
  type_in._M_str = inputType._M_str;
  type_in._M_len = inputType._M_len;
  this = &ConnectorFederateManager::registerCloningFilter(pCVar1,name,type_in,type_out)->
          super_Filter;
LAB_001b1f95:
  if (operation != CUSTOM) {
    Filter::setFilterType(this,operation);
  }
  return this;
}

Assistant:

static Filter& generateFilter(Federate* fed,
                              bool global,
                              bool cloning,
                              std::string_view name,
                              FilterTypes operation,
                              std::string_view inputType,
                              std::string_view outputType)
{
    auto& filt = registerFilter(fed, global, cloning, name, inputType, outputType);
    if (operation != FilterTypes::CUSTOM) {
        filt.setFilterType(static_cast<std::int32_t>(operation));
    }
    return filt;
}